

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_unpack(lua_State *L)

{
  int iVar1;
  lua_Integer pos_00;
  size_t sVar2;
  char *len_00;
  size_t len_01;
  size_t len_1;
  size_t len;
  lua_Number num;
  Ftypes u;
  lua_Integer res;
  KOption opt;
  int ntoalign;
  int size;
  int n;
  size_t pos;
  char *data;
  size_t ld;
  char *fmt;
  Header h;
  lua_State *L_local;
  
  h._8_8_ = L;
  ld = (size_t)luaL_checklstring(L,1,(size_t *)0x0);
  pos = (size_t)luaL_checklstring((lua_State *)h._8_8_,2,(size_t *)&data);
  pos_00 = luaL_optinteger((lua_State *)h._8_8_,3,1);
  sVar2 = posrelatI(pos_00,(size_t)data);
  _size = (char *)(sVar2 - 1);
  ntoalign = 0;
  if (data < _size) {
    luaL_argerror((lua_State *)h._8_8_,3,"initial position out of string");
  }
  initheader((lua_State *)h._8_8_,(Header *)&fmt);
  while (*(char *)ld != '\0') {
    res._0_4_ = getdetails((Header *)&fmt,(size_t)_size,(char **)&ld,(int *)&opt,
                           (int *)((long)&res + 4));
    if ((ulong)((long)data - (long)_size) < (ulong)((long)res._4_4_ + (long)(int)opt)) {
      luaL_argerror((lua_State *)h._8_8_,2,"data string too short");
    }
    _size = _size + res._4_4_;
    luaL_checkstack((lua_State *)h._8_8_,2,"too many results");
    iVar1 = ntoalign + 1;
    switch((KOption)res) {
    case Kint:
    case Kuint:
      ntoalign = iVar1;
      u = (Ftypes)unpackint((lua_State *)h._8_8_,_size + pos,(int)h.L,opt,
                            (uint)((KOption)res == Kint));
      lua_pushinteger((lua_State *)h._8_8_,(lua_Integer)u);
      iVar1 = ntoalign;
      break;
    case Kfloat:
      ntoalign = iVar1;
      copywithendian((char *)&num,_size + pos,opt,(int)h.L);
      if (opt == Kstring) {
        len = (size_t)(double)num._0_4_;
      }
      else {
        len = CONCAT44(num._4_4_,num._0_4_);
      }
      lua_pushnumber((lua_State *)h._8_8_,(lua_Number)len);
      iVar1 = ntoalign;
      break;
    case Kchar:
      ntoalign = iVar1;
      lua_pushlstring((lua_State *)h._8_8_,_size + pos,(long)(int)opt);
      iVar1 = ntoalign;
      break;
    case Kstring:
      ntoalign = iVar1;
      len_00 = (char *)unpackint((lua_State *)h._8_8_,_size + pos,(int)h.L,opt,0);
      if (data + (-(long)(int)opt - (long)_size) < len_00) {
        luaL_argerror((lua_State *)h._8_8_,2,"data string too short");
      }
      lua_pushlstring((lua_State *)h._8_8_,_size + (long)(int)opt + pos,(size_t)len_00);
      _size = _size + (long)len_00;
      iVar1 = ntoalign;
      break;
    case Kzstr:
      ntoalign = iVar1;
      len_01 = strlen(_size + pos);
      if (data <= _size + len_01) {
        luaL_argerror((lua_State *)h._8_8_,2,"unfinished string for format \'z\'");
      }
      lua_pushlstring((lua_State *)h._8_8_,_size + pos,len_01);
      _size = _size + len_01 + 1;
      iVar1 = ntoalign;
      break;
    case Kpadding:
    case Kpaddalign:
    case Knop:
      iVar1 = ntoalign;
    }
    ntoalign = iVar1;
    _size = _size + (int)opt;
  }
  lua_pushinteger((lua_State *)h._8_8_,(lua_Integer)(_size + 1));
  return ntoalign + 1;
}

Assistant:

static int str_unpack (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);
  size_t ld;
  const char *data = luaL_checklstring(L, 2, &ld);
  size_t pos = posrelatI(luaL_optinteger(L, 3, 1), ld) - 1;
  int n = 0;  /* number of results */
  luaL_argcheck(L, pos <= ld, 3, "initial position out of string");
  initheader(L, &h);
  while (*fmt != '\0') {
    int size, ntoalign;
    KOption opt = getdetails(&h, pos, &fmt, &size, &ntoalign);
    luaL_argcheck(L, (size_t)ntoalign + size <= ld - pos, 2,
                    "data string too short");
    pos += ntoalign;  /* skip alignment */
    /* stack space for item + next position */
    luaL_checkstack(L, 2, "too many results");
    n++;
    switch (opt) {
      case Kint:
      case Kuint: {
        lua_Integer res = unpackint(L, data + pos, h.islittle, size,
                                       (opt == Kint));
        lua_pushinteger(L, res);
        break;
      }
      case Kfloat: {
        Ftypes u;
        lua_Number num;
        copywithendian((char *)&u, data + pos, size, h.islittle);
        if (size == sizeof(u.f)) num = (lua_Number)u.f;
        else if (size == sizeof(u.d)) num = (lua_Number)u.d;
        else num = u.n;
        lua_pushnumber(L, num);
        break;
      }
      case Kchar: {
        lua_pushlstring(L, data + pos, size);
        break;
      }
      case Kstring: {
        size_t len = (size_t)unpackint(L, data + pos, h.islittle, size, 0);
        luaL_argcheck(L, len <= ld - pos - size, 2, "data string too short");
        lua_pushlstring(L, data + pos + size, len);
        pos += len;  /* skip string */
        break;
      }
      case Kzstr: {
        size_t len = strlen(data + pos);
        luaL_argcheck(L, pos + len < ld, 2,
                         "unfinished string for format 'z'");
        lua_pushlstring(L, data + pos, len);
        pos += len + 1;  /* skip string plus final '\0' */
        break;
      }
      case Kpaddalign: case Kpadding: case Knop:
        n--;  /* undo increment */
        break;
    }
    pos += size;
  }
  lua_pushinteger(L, pos + 1);  /* next position */
  return n + 1;
}